

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O3

void __thiscall Timidity::Renderer::note_on(Renderer *this,int chan,int note,int vel)

{
  Voice *pVVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  int i;
  long lVar5;
  
  if (vel == 0) {
    note_off(this,chan,note,0);
    return;
  }
  i = this->voices;
  lVar5 = (long)i;
  if (lVar5 != 0) {
    piVar4 = &this->channel[(uint)chan].mono;
    lVar2 = lVar5 * 0x170;
    do {
      i = i + -1;
      pVVar1 = this->voice;
      if ((uint)(&pVVar1[-1].channel)[lVar2] == chan) {
        if ((uint)(&pVVar1[-1].note)[lVar2] == note) {
          iVar3 = *piVar4;
          if (*(char *)(*(long *)((long)&pVVar1[-1].sample + lVar2) + 0x50) == '\x01')
          goto LAB_003563d3;
          if (iVar3 == 0) {
            finish_note(this,i);
            goto LAB_003563e8;
          }
        }
        else {
          iVar3 = *piVar4;
LAB_003563d3:
          if (iVar3 == 0) goto LAB_003563e8;
        }
        if (((&pVVar1[-1].status)[lVar2] & 1) != 0) {
          (&pVVar1[-1].status)[lVar2] = (&pVVar1[-1].status)[lVar2] & 0xf1 | 0xc;
        }
      }
LAB_003563e8:
      lVar5 = lVar5 + -1;
      lVar2 = lVar2 + -0x170;
    } while (lVar5 != 0);
  }
  start_note(this,chan,note,vel);
  return;
}

Assistant:

void Renderer::note_on(int chan, int note, int vel)
{
	if (vel == 0)
	{
		note_off(chan, note, 0);
		return;
	}

	int i = voices;

	/* Only one instance of a note can be playing on a single channel. */
	while (i--)
	{
		if (voice[i].channel == chan && ((voice[i].note == note && !voice[i].sample->self_nonexclusive) || channel[chan].mono))
		{
			if (channel[chan].mono)
			{
				kill_note(i);
			}
			else
			{
				finish_note(i);
			}
		}
	}

	start_note(chan, note, vel);
}